

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Nullability __thiscall
wasm::TranslateToFuzzReader::getSubType(TranslateToFuzzReader *this,Nullability nullability)

{
  Nullability NVar1;
  
  if (nullability != NonNullable) {
    NVar1 = getNullability(this);
    return NVar1;
  }
  return NonNullable;
}

Assistant:

Nullability TranslateToFuzzReader::getSubType(Nullability nullability) {
  if (nullability == NonNullable) {
    return NonNullable;
  }
  return getNullability();
}